

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall graphics101::Mesh::computeNormalsHalfEdge(Mesh *this,MeshNormalStrategy strategy)

{
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *__x;
  pointer pvVar1;
  Edges edges;
  HalfEdgeTriMesh halfedges;
  
  pvVar1 = (this->normals).
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->normals).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    (this->normals).
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  }
  halfedges.m_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  halfedges.m_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)halfedges.m_halfedges.
                        super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(&this->normals,
           ((long)(this->positions).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->positions).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xc,(value_type *)&halfedges);
  __x = &this->face_positions;
  std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::operator=
            (&this->face_normals,__x);
  edges.
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  edges.
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  edges.
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unordered_edges_from_triangles(__x,&edges);
  halfedges.m_directed_edge2he_index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &halfedges.m_directed_edge2he_index._M_t._M_impl.super__Rb_tree_header._M_header;
  halfedges.m_directed_edge2he_index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  halfedges.m_directed_edge2he_index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  halfedges.m_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  halfedges.m_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  halfedges.m_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  halfedges.m_vertex_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  halfedges.m_vertex_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  halfedges.m_vertex_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  halfedges.m_face_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  halfedges.m_face_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  halfedges.m_face_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  halfedges.m_edge_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  halfedges.m_edge_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  halfedges.m_edge_halfedges.
  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  halfedges.m_directed_edge2he_index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  halfedges.m_directed_edge2he_index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       halfedges.m_directed_edge2he_index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  HalfEdgeTriMesh::build
            (&halfedges,
             ((long)(this->positions).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->positions).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc,__x,&edges);
  HalfEdgeTriMesh::~HalfEdgeTriMesh(&halfedges);
  std::
  _Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&edges.
                   super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                 );
  return;
}

Assistant:

void Mesh::computeNormalsHalfEdge( MeshNormalStrategy strategy ) {
    
    // Clear any existing normals.
    normals.clear();
    // Make space for a normal for each position. Initialize them to 0.
    normals.resize( positions.size(), vec3(0,0,0) );
    // Since there is a normal for each position, face_normals should be identical
    // to face_positions.
    face_normals = face_positions;
    
    // Build the halfedges.
    typedef HalfEdgeTriMesh::Index Index;
    HalfEdgeTriMesh::Edges edges;
    unordered_edges_from_triangles( face_positions, edges );
    HalfEdgeTriMesh halfedges;
    halfedges.build( positions.size(), face_positions, edges );
    // You will use halfedges to collect all incident faces at a vertex with:
    //     halfedges.vertex_face_neighbors( vertex_index );
    
    // Your code goes here.
    
    // Iterate over vertices.
    
    // Normalize all normals.
    
}